

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::MRSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                 Image *ref,Image *mrseImage)

{
  float fVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  size_t sVar3;
  float fVar4;
  Allocator alloc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  Point2i PVar10;
  int c;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D local_1d8;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  WrapMode2D local_1a0;
  vector<double,_std::allocator<double>_> sumRSE;
  ColorEncodingHandle local_180;
  ImageChannelDesc refDesc;
  Point2i va;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [8];
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumRSE,(desc->offset).nStored,(value_type_conflict3 *)&va,(allocator_type *)&refDesc);
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n = (long)local_140 - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x266,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar9;
  if (TVar9 == vb.super_Tuple2<pbrt::Point2,_int>) {
    if (mrseImage != (Image *)0x0) {
      ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&vb,this);
      PVar10.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_180.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar11 = (long)local_1c8 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar11 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar10.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar9,channels,&local_180,alloc);
      operator=(mrseImage,(Image *)&va);
      ~Image((Image *)&va);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    for (lVar11 = 0; lVar11 < (long)TVar9 >> 0x20; lVar11 = lVar11 + 1) {
      for (uVar7 = 0; (long)uVar7 < (long)TVar9.x; uVar7 = uVar7 + 1) {
        WrapMode2D::WrapMode2D(&local_1a0,Clamp);
        PVar10.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar11 << 0x20 | uVar7)
        ;
        GetChannels((ImageChannelValues *)&va,this,PVar10,desc,local_1a0);
        WrapMode2D::WrapMode2D(&local_1d8,Clamp);
        GetChannels((ImageChannelValues *)&vb,ref,PVar10,&refDesc,local_1d8);
        for (uVar12 = 0; uVar12 < (desc->offset).nStored; uVar12 = uVar12 + 1) {
          pbVar5 = local_140;
          if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar5 = local_138;
          }
          pbVar6 = local_1c8;
          if (local_1c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar6 = &local_1c0;
          }
          fVar1 = *(float *)((long)&(pbVar6->_M_dataplus)._M_p + uVar12 * 4);
          fVar4 = *(float *)((long)&(pbVar5->_M_dataplus)._M_p + uVar12 * 4) - fVar1;
          fVar1 = fVar1 + 0.01;
          fVar1 = (fVar4 * fVar4) / (fVar1 * fVar1);
          if (ABS(fVar1) != INFINITY) {
            sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12] =
                 (double)fVar1 +
                 sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
            if (mrseImage != (Image *)0x0) {
              SetChannel(mrseImage,PVar10,(int)uVar12,fVar1);
            }
          }
        }
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&vb);
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
        TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      }
    }
    ImageChannelValues::ImageChannelValues(__return_storage_ptr__,(desc->offset).nStored,0.0);
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    sVar3 = (desc->offset).nStored;
    paVar8 = &(__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
    if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar8 = paVar2;
    }
    for (sVar13 = 0; sVar3 != sVar13; sVar13 = sVar13 + 1) {
      TVar9 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      paVar8->fixed[sVar13] =
           (float)(sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar13] / (double)(TVar9.y * TVar9.x));
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&refDesc.offset);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&sumRSE.super__Vector_base<double,_std::allocator<double>_>);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x267,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x4a4d42,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x4a4d42,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MRSE(const ImageChannelDesc &desc, const Image &ref,
                               Image *mrseImage) const {
    std::vector<double> sumRSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (mrseImage)
        *mrseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float rse = Sqr(v[c] - vref[c]) / Sqr(vref[c] + 0.01);
                if (std::isinf(rse))
                    continue;
                sumRSE[c] += rse;
                if (mrseImage)
                    mrseImage->SetChannel({x, y}, c, rse);
            }
        }

    ImageChannelValues mrse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mrse[c] = sumRSE[c] / (Resolution().x * Resolution().y);
    return mrse;
}